

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_crt_check_parent(mbedtls_x509_crt *child,mbedtls_x509_crt *parent,int top,int bottom)

{
  size_t __n;
  int iVar1;
  int iVar2;
  
  iVar1 = x509_name_cmp(&child->issuer,&parent->subject);
  if (iVar1 != 0) {
    return -1;
  }
  if (top != 0) {
    iVar1 = parent->version;
    if ((bottom == 0) || (__n = (child->raw).len, __n != (parent->raw).len)) {
      if (iVar1 < 3) {
        return 0;
      }
    }
    else {
      iVar2 = bcmp((child->raw).p,(parent->raw).p,__n);
      if (iVar2 == 0 || iVar1 < 3) {
        return 0;
      }
    }
  }
  if (parent->ca_istrue != 0) {
    iVar1 = mbedtls_x509_crt_check_key_usage(parent,4);
    if (iVar1 == 0) {
      return 0;
    }
    return -1;
  }
  return -1;
}

Assistant:

static int x509_crt_check_parent( const mbedtls_x509_crt *child,
                                  const mbedtls_x509_crt *parent,
                                  int top, int bottom )
{
    int need_ca_bit;

    /* Parent must be the issuer */
    if( x509_name_cmp( &child->issuer, &parent->subject ) != 0 )
        return( -1 );

    /* Parent must have the basicConstraints CA bit set as a general rule */
    need_ca_bit = 1;

    /* Exception: v1/v2 certificates that are locally trusted. */
    if( top && parent->version < 3 )
        need_ca_bit = 0;

    /* Exception: self-signed end-entity certs that are locally trusted. */
    if( top && bottom &&
        child->raw.len == parent->raw.len &&
        memcmp( child->raw.p, parent->raw.p, child->raw.len ) == 0 )
    {
        need_ca_bit = 0;
    }

    if( need_ca_bit && ! parent->ca_istrue )
        return( -1 );

#if defined(MBEDTLS_X509_CHECK_KEY_USAGE)
    if( need_ca_bit &&
        mbedtls_x509_crt_check_key_usage( parent, MBEDTLS_X509_KU_KEY_CERT_SIGN ) != 0 )
    {
        return( -1 );
    }
#endif

    return( 0 );
}